

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall TasGrid::GridGlobal::loadGpuValues<double>(GridGlobal *this)

{
  AccelerationContext *acc;
  bool bVar1;
  pointer pCVar2;
  const_iterator ibegin;
  const_iterator iend;
  unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
  local_20;
  unique_ptr *local_18;
  unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
  *ccache;
  GridGlobal *this_local;
  
  ccache = (unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
            *)this;
  local_18 = (unique_ptr *)getGpuCache<double>(this);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool(local_18);
  if (!bVar1) {
    Utils::make_unique<TasGrid::CudaGlobalData<double>>();
    ::std::
    unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::operator=((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 *)local_18,&local_20);
    ::std::
    unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::~unique_ptr(&local_20);
  }
  pCVar2 = ::std::
           unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
           ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                         *)local_18);
  bVar1 = GpuVector<double>::empty(&pCVar2->values);
  if (bVar1) {
    pCVar2 = ::std::
             unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ::operator->((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                           *)local_18);
    acc = (this->super_BaseCanonicalGrid).acceleration;
    ibegin = StorageSet::begin(&(this->super_BaseCanonicalGrid).values);
    iend = StorageSet::end(&(this->super_BaseCanonicalGrid).values);
    GpuVector<double>::
    load<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
              (&pCVar2->values,acc,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               ibegin._M_current,
               (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
               iend._M_current);
  }
  return;
}

Assistant:

void GridGlobal::loadGpuValues() const{
    auto& ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaGlobalData<T>>();
    if (ccache->values.empty()) ccache->values.load(acceleration, values.begin(), values.end());
}